

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::CopyImage::InvalidAlignmentTest::iterate(InvalidAlignmentTest *this)

{
  int iVar1;
  GLuint GVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  size_type sVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_218;
  GetNameFunc local_208;
  int local_200;
  Enum<int,_2UL> local_1f8;
  MessageBuilder local_1e8;
  Exception *exc;
  reference local_50;
  testCase *test_case;
  byte local_3d;
  GLuint temp;
  bool result;
  long lStack_38;
  IterateResult it_result;
  Functions *gl;
  InvalidAlignmentTest *pIStack_28;
  GLenum error;
  InvalidAlignmentTest *this_local;
  
  gl._4_4_ = 0;
  pIStack_28 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_38 = CONCAT44(extraout_var,iVar1);
  temp = 0;
  local_3d = 0;
  test_case._4_4_ = 0;
  local_50 = std::
             vector<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
             ::operator[](&this->m_test_cases,(ulong)this->m_test_case_index);
  GVar2 = Utils::prepareTex16x16x6
                    ((this->super_TestCase).m_context,0xde1,0x8dbd,0x8227,0x1401,
                     (GLuint *)((long)&test_case + 4));
  this->m_dst_tex_name = GVar2;
  GVar2 = Utils::prepareTex16x16x6
                    ((this->super_TestCase).m_context,0xde1,0x8dbd,0x8227,0x1401,
                     (GLuint *)((long)&test_case + 4));
  this->m_src_tex_name = GVar2;
  Utils::makeTextureComplete((this->super_TestCase).m_context,0xde1,this->m_dst_tex_name,0,0);
  Utils::makeTextureComplete((this->super_TestCase).m_context,0xde1,this->m_src_tex_name,0,0);
  (**(code **)(lStack_38 + 0x310))
            (this->m_src_tex_name,0xde1,0,local_50->m_src_x,local_50->m_src_y,0,this->m_dst_tex_name
             ,0xde1,0,local_50->m_dst_x,local_50->m_dst_y,0,local_50->m_width,local_50->m_height,1);
  gl._4_4_ = (**(code **)(lStack_38 + 0x800))();
  local_3d = local_50->m_expected_result == gl._4_4_;
  clean(this);
  if ((local_3d & 1) == 1) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_PASS,"Pass");
    this->m_test_case_index = this->m_test_case_index + 1;
    sVar5 = std::
            vector<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
            ::size(&this->m_test_cases);
    if (this->m_test_case_index < sVar5) {
      temp = 1;
    }
  }
  else {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_00 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_1e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_1e8,(char (*) [27])"Failure. Expected result: ")
    ;
    EVar7 = glu::getErrorStr(local_50->m_expected_result);
    local_208 = EVar7.m_getName;
    local_200 = EVar7.m_value;
    local_1f8.m_getName = local_208;
    local_1f8.m_value = local_200;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1f8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2b39b91);
    EVar7 = glu::getErrorStr(gl._4_4_);
    local_218.m_getName = EVar7.m_getName;
    local_218.m_value = EVar7.m_value;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_218);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])". source: [");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_50->m_src_x);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_50->m_src_y);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [18])"], destination: [");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_50->m_src_x);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_50->m_src_y);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [10])"], size: ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_50->m_width);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])" x ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_50->m_height);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e8);
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,"Fail");
  }
  return temp;
}

Assistant:

tcu::TestNode::IterateResult InvalidAlignmentTest::iterate()
{
	GLenum						 error	 = GL_NO_ERROR;
	const Functions&			 gl		   = m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result = tcu::TestNode::STOP;
	bool						 result	= false;
	GLuint						 temp	  = 0;
	const testCase&				 test_case = m_test_cases[m_test_case_index];

	try
	{
		/* Prepare textures */
		m_dst_tex_name =
			Utils::prepareTex16x16x6(m_context, GL_TEXTURE_2D, GL_COMPRESSED_RG_RGTC2, GL_RG, GL_UNSIGNED_BYTE, temp);
		m_src_tex_name =
			Utils::prepareTex16x16x6(m_context, GL_TEXTURE_2D, GL_COMPRESSED_RG_RGTC2, GL_RG, GL_UNSIGNED_BYTE, temp);

		/* Make textures complete */
		Utils::makeTextureComplete(m_context, GL_TEXTURE_2D, m_dst_tex_name, 0 /* base */, 0 /* max */);
		Utils::makeTextureComplete(m_context, GL_TEXTURE_2D, m_src_tex_name, 0 /* base */, 0 /* max */);
	}
	catch (tcu::Exception& exc)
	{
		clean();
		throw exc;
	}

	/* Execute CopyImageSubData */
	gl.copyImageSubData(m_src_tex_name, GL_TEXTURE_2D, 0 /* level */, test_case.m_src_x /* srcX */,
						test_case.m_src_y /* srcY */, 0 /* srcZ */, m_dst_tex_name, GL_TEXTURE_2D, 0 /* level */,
						test_case.m_dst_x /* dstX */, test_case.m_dst_y /* dstY */, 0 /* dstZ */,
						test_case.m_width /* srcWidth */, test_case.m_height /* srcHeight */, 1 /* srcDepth */);

	/* Verify generated error */
	error  = gl.getError();
	result = (test_case.m_expected_result == error);

	/* Free resources */
	clean();

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Failure. Expected result: " << glu::getErrorStr(test_case.m_expected_result)
			<< " got: " << glu::getErrorStr(error) << ". source: [" << test_case.m_src_x << ", " << test_case.m_src_y
			<< "], destination: [" << test_case.m_src_x << ", " << test_case.m_src_y << "], size: " << test_case.m_width
			<< " x " << test_case.m_height << tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}